

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::createInvocationsOperation
          (TGlslangToSpvTraverser *this,TOperator op,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,TBasicType typeProxy)

{
  SpvBuildLogger *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Id IVar4;
  reference puVar5;
  allocator<char> local_d9;
  string local_d8;
  Id local_b4;
  Id local_b0;
  Id uvec2Type;
  undefined1 local_a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> components;
  Id result;
  Id uvec4Type;
  Id uintType;
  IdImmediate op_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  iterator opIt;
  IdImmediate groupOp;
  IdImmediate scope;
  GroupOperation groupOperation;
  vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> spvGroupOperands;
  Op opCode;
  bool isFloat;
  bool isUnsigned;
  TBasicType typeProxy_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operands_local;
  Id typeId_local;
  TOperator op_local;
  TGlslangToSpvTraverser *this_local;
  
  bVar1 = glslang::isTypeUnsignedInt(typeProxy);
  bVar2 = glslang::isTypeFloat(typeProxy);
  std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::vector
            ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&scope.word);
  scope.isId = true;
  scope._1_3_ = 0x7fffff;
  if (((op == EOpBallot) || (op == EOpReadFirstInvocation)) || (op == EOpReadInvocation)) {
    spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_ballot");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupBallotKHR);
  }
  else if (((op == EOpAnyInvocation) || (op == EOpAllInvocations)) || (op == EOpAllInvocationsEqual)
          ) {
    spv::Builder::addExtension(&this->builder,"SPV_KHR_subgroup_vote");
    spv::Builder::addCapability(&this->builder,CapabilitySubgroupVoteKHR);
  }
  else {
    spv::Builder::addCapability(&this->builder,CapabilityGroups);
    if (((op == EOpMinInvocationsNonUniform) || (op == EOpMaxInvocationsNonUniform)) ||
       (((op == EOpAddInvocationsNonUniform ||
         ((((op == EOpMinInvocationsInclusiveScanNonUniform ||
            (op == EOpMaxInvocationsInclusiveScanNonUniform)) ||
           (op == EOpAddInvocationsInclusiveScanNonUniform)) ||
          ((op == EOpMinInvocationsExclusiveScanNonUniform ||
           (op == EOpMaxInvocationsExclusiveScanNonUniform)))))) ||
        (op == EOpAddInvocationsExclusiveScanNonUniform)))) {
      spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_ballot");
    }
    if (op - EOpMinInvocations < 6) {
      scope.isId = false;
      scope._1_3_ = 0;
    }
    else if (op - EOpMinInvocationsInclusiveScan < 6) {
      scope.isId = true;
      scope._1_3_ = 0;
    }
    else if (op - EOpMinInvocationsExclusiveScan < 6) {
      scope.isId = true;
      scope._1_3_ = 0;
    }
    IVar4 = spv::Builder::makeUintConstant(&this->builder,3,false);
    spv::IdImmediate::IdImmediate(&groupOp,true,IVar4);
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&scope.word,&groupOp);
    if (scope._0_4_ != 0x7fffffff) {
      spv::IdImmediate::IdImmediate((IdImmediate *)((long)&opIt._M_current + 4),false,scope._0_4_);
      std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
                ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&scope.word,
                 (value_type *)((long)&opIt._M_current + 4));
    }
  }
  local_70._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(operands);
  while( true ) {
    op_1 = (IdImmediate)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(operands);
    bVar3 = __gnu_cxx::operator!=
                      (&local_70,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&op_1);
    if (!bVar3) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_70);
    spv::IdImmediate::IdImmediate((IdImmediate *)&uintType,true,*puVar5);
    std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::push_back
              ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&scope.word,
               (value_type *)&uintType);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&local_70);
  }
  switch(op) {
  case EOpBallot:
    IVar4 = spv::Builder::makeUintType(&this->builder,0x20);
    components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::makeVectorType(&this->builder,IVar4,4);
    components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         spv::Builder::createOp
                   (&this->builder,OpSubgroupBallotKHR,
                    components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                    (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&scope.word);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    uvec2Type = spv::Builder::createCompositeExtract
                          (&this->builder,
                           (Id)components.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,IVar4,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,&uvec2Type);
    local_b0 = spv::Builder::createCompositeExtract
                         (&this->builder,
                          (Id)components.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,IVar4,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,&local_b0);
    local_b4 = spv::Builder::makeVectorType(&this->builder,IVar4,2);
    IVar4 = spv::Builder::createCompositeConstruct
                      (&this->builder,local_b4,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    this_local._4_4_ = spv::Builder::createUnaryOp(&this->builder,OpBitcast,typeId,IVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    goto LAB_005d39e0;
  case EOpReadInvocation:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpSubgroupReadInvocationKHR;
    bVar1 = spv::Builder::isVectorType(&this->builder,typeId);
    if (bVar1) {
      this_local._4_4_ =
           CreateInvocationsVectorOperation
                     (this,OpSubgroupReadInvocationKHR,scope._0_4_,typeId,operands);
      goto LAB_005d39e0;
    }
    break;
  case EOpReadFirstInvocation:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpSubgroupFirstInvocationKHR;
    bVar1 = spv::Builder::isVectorType(&this->builder,typeId);
    if (bVar1) {
      this_local._4_4_ =
           CreateInvocationsVectorOperation
                     (this,OpSubgroupFirstInvocationKHR,scope._0_4_,typeId,operands);
      goto LAB_005d39e0;
    }
    break;
  case EOpAnyInvocation:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpSubgroupAnyKHR;
    break;
  case EOpAllInvocations:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpSubgroupAllKHR;
    break;
  case EOpAllInvocationsEqual:
    spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage._4_4_ = OpSubgroupAllEqualKHR;
    break;
  default:
    this_00 = this->logger;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"invocation operation",&local_d9);
    spv::SpvBuildLogger::missingFunctionality(this_00,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    this_local._4_4_ = 0;
    goto LAB_005d39e0;
  case EOpMinInvocations:
  case EOpMaxInvocations:
  case EOpAddInvocations:
  case EOpMinInvocationsInclusiveScan:
  case EOpMaxInvocationsInclusiveScan:
  case EOpAddInvocationsInclusiveScan:
  case EOpMinInvocationsExclusiveScan:
  case EOpMaxInvocationsExclusiveScan:
  case EOpAddInvocationsExclusiveScan:
    if (((op == EOpMinInvocations) || (op == EOpMinInvocationsInclusiveScan)) ||
       (op == EOpMinInvocationsExclusiveScan)) {
      if (bVar2) {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupFMin;
      }
      else if (bVar1) {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupUMin;
      }
      else {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupSMin;
      }
    }
    else if (((op == EOpMaxInvocations) || (op == EOpMaxInvocationsInclusiveScan)) ||
            (op == EOpMaxInvocationsExclusiveScan)) {
      if (bVar2) {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupFMax;
      }
      else if (bVar1) {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupUMax;
      }
      else {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupSMax;
      }
    }
    else if (bVar2) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupFAdd;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupIAdd;
    }
    bVar1 = spv::Builder::isVectorType(&this->builder,typeId);
    if (bVar1) {
      this_local._4_4_ =
           CreateInvocationsVectorOperation
                     (this,spvGroupOperands.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,scope._0_4_,
                      typeId,operands);
      goto LAB_005d39e0;
    }
    break;
  case EOpMinInvocationsNonUniform:
  case EOpMaxInvocationsNonUniform:
  case EOpAddInvocationsNonUniform:
  case EOpMinInvocationsInclusiveScanNonUniform:
  case EOpMaxInvocationsInclusiveScanNonUniform:
  case EOpAddInvocationsInclusiveScanNonUniform:
  case EOpMinInvocationsExclusiveScanNonUniform:
  case EOpMaxInvocationsExclusiveScanNonUniform:
  case EOpAddInvocationsExclusiveScanNonUniform:
    if (((op == EOpMinInvocationsNonUniform) || (op == EOpMinInvocationsInclusiveScanNonUniform)) ||
       (op == EOpMinInvocationsExclusiveScanNonUniform)) {
      if (bVar2) {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupFMinNonUniformAMD;
      }
      else if (bVar1) {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupUMinNonUniformAMD;
      }
      else {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupSMinNonUniformAMD;
      }
    }
    else if (((op == EOpMaxInvocationsNonUniform) ||
             (op == EOpMaxInvocationsInclusiveScanNonUniform)) ||
            (op == EOpMaxInvocationsExclusiveScanNonUniform)) {
      if (bVar2) {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupFMaxNonUniformAMD;
      }
      else if (bVar1) {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupUMaxNonUniformAMD;
      }
      else {
        spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupSMaxNonUniformAMD;
      }
    }
    else if (bVar2) {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupFAddNonUniformAMD;
    }
    else {
      spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = OpGroupIAddNonUniformAMD;
    }
    bVar1 = spv::Builder::isVectorType(&this->builder,typeId);
    if (bVar1) {
      this_local._4_4_ =
           CreateInvocationsVectorOperation
                     (this,spvGroupOperands.
                           super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,scope._0_4_,
                      typeId,operands);
      goto LAB_005d39e0;
    }
  }
  if (spvGroupOperands.super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == OpNop) {
    __assert_fail("opCode != spv::OpNop",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x21d5,
                  "spv::Id (anonymous namespace)::TGlslangToSpvTraverser::createInvocationsOperation(glslang::TOperator, spv::Id, std::vector<spv::Id> &, glslang::TBasicType)"
                 );
  }
  this_local._4_4_ =
       spv::Builder::createOp
                 (&this->builder,
                  spvGroupOperands.
                  super__Vector_base<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,typeId,
                  (vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&scope.word);
LAB_005d39e0:
  std::vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_>::~vector
            ((vector<spv::IdImmediate,_std::allocator<spv::IdImmediate>_> *)&scope.word);
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createInvocationsOperation(glslang::TOperator op, spv::Id typeId,
    std::vector<spv::Id>& operands, glslang::TBasicType typeProxy)
{
    bool isUnsigned = isTypeUnsignedInt(typeProxy);
    bool isFloat = isTypeFloat(typeProxy);

    spv::Op opCode = spv::OpNop;
    std::vector<spv::IdImmediate> spvGroupOperands;
    spv::GroupOperation groupOperation = spv::GroupOperationMax;

    if (op == glslang::EOpBallot || op == glslang::EOpReadFirstInvocation ||
        op == glslang::EOpReadInvocation) {
        builder.addExtension(spv::E_SPV_KHR_shader_ballot);
        builder.addCapability(spv::CapabilitySubgroupBallotKHR);
    } else if (op == glslang::EOpAnyInvocation ||
        op == glslang::EOpAllInvocations ||
        op == glslang::EOpAllInvocationsEqual) {
        builder.addExtension(spv::E_SPV_KHR_subgroup_vote);
        builder.addCapability(spv::CapabilitySubgroupVoteKHR);
    } else {
        builder.addCapability(spv::CapabilityGroups);
        if (op == glslang::EOpMinInvocationsNonUniform ||
            op == glslang::EOpMaxInvocationsNonUniform ||
            op == glslang::EOpAddInvocationsNonUniform ||
            op == glslang::EOpMinInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMaxInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpAddInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMinInvocationsExclusiveScanNonUniform ||
            op == glslang::EOpMaxInvocationsExclusiveScanNonUniform ||
            op == glslang::EOpAddInvocationsExclusiveScanNonUniform)
            builder.addExtension(spv::E_SPV_AMD_shader_ballot);

        switch (op) {
        case glslang::EOpMinInvocations:
        case glslang::EOpMaxInvocations:
        case glslang::EOpAddInvocations:
        case glslang::EOpMinInvocationsNonUniform:
        case glslang::EOpMaxInvocationsNonUniform:
        case glslang::EOpAddInvocationsNonUniform:
            groupOperation = spv::GroupOperationReduce;
            break;
        case glslang::EOpMinInvocationsInclusiveScan:
        case glslang::EOpMaxInvocationsInclusiveScan:
        case glslang::EOpAddInvocationsInclusiveScan:
        case glslang::EOpMinInvocationsInclusiveScanNonUniform:
        case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
        case glslang::EOpAddInvocationsInclusiveScanNonUniform:
            groupOperation = spv::GroupOperationInclusiveScan;
            break;
        case glslang::EOpMinInvocationsExclusiveScan:
        case glslang::EOpMaxInvocationsExclusiveScan:
        case glslang::EOpAddInvocationsExclusiveScan:
        case glslang::EOpMinInvocationsExclusiveScanNonUniform:
        case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
        case glslang::EOpAddInvocationsExclusiveScanNonUniform:
            groupOperation = spv::GroupOperationExclusiveScan;
            break;
        default:
            break;
        }
        spv::IdImmediate scope = { true, builder.makeUintConstant(spv::ScopeSubgroup) };
        spvGroupOperands.push_back(scope);
        if (groupOperation != spv::GroupOperationMax) {
            spv::IdImmediate groupOp = { false, (unsigned)groupOperation };
            spvGroupOperands.push_back(groupOp);
        }
    }

    for (auto opIt = operands.begin(); opIt != operands.end(); ++opIt) {
        spv::IdImmediate op = { true, *opIt };
        spvGroupOperands.push_back(op);
    }

    switch (op) {
    case glslang::EOpAnyInvocation:
        opCode = spv::OpSubgroupAnyKHR;
        break;
    case glslang::EOpAllInvocations:
        opCode = spv::OpSubgroupAllKHR;
        break;
    case glslang::EOpAllInvocationsEqual:
        opCode = spv::OpSubgroupAllEqualKHR;
        break;
    case glslang::EOpReadInvocation:
        opCode = spv::OpSubgroupReadInvocationKHR;
        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);
        break;
    case glslang::EOpReadFirstInvocation:
        opCode = spv::OpSubgroupFirstInvocationKHR;
        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);
        break;
    case glslang::EOpBallot:
    {
        // NOTE: According to the spec, the result type of "OpSubgroupBallotKHR" must be a 4 component vector of 32
        // bit integer types. The GLSL built-in function "ballotARB()" assumes the maximum number of invocations in
        // a subgroup is 64. Thus, we have to convert uvec4.xy to uint64_t as follow:
        //
        //     result = Bitcast(SubgroupBallotKHR(Predicate).xy)
        //
        spv::Id uintType  = builder.makeUintType(32);
        spv::Id uvec4Type = builder.makeVectorType(uintType, 4);
        spv::Id result = builder.createOp(spv::OpSubgroupBallotKHR, uvec4Type, spvGroupOperands);

        std::vector<spv::Id> components;
        components.push_back(builder.createCompositeExtract(result, uintType, 0));
        components.push_back(builder.createCompositeExtract(result, uintType, 1));

        spv::Id uvec2Type = builder.makeVectorType(uintType, 2);
        return builder.createUnaryOp(spv::OpBitcast, typeId,
                                     builder.createCompositeConstruct(uvec2Type, components));
    }

    case glslang::EOpMinInvocations:
    case glslang::EOpMaxInvocations:
    case glslang::EOpAddInvocations:
    case glslang::EOpMinInvocationsInclusiveScan:
    case glslang::EOpMaxInvocationsInclusiveScan:
    case glslang::EOpAddInvocationsInclusiveScan:
    case glslang::EOpMinInvocationsExclusiveScan:
    case glslang::EOpMaxInvocationsExclusiveScan:
    case glslang::EOpAddInvocationsExclusiveScan:
        if (op == glslang::EOpMinInvocations ||
            op == glslang::EOpMinInvocationsInclusiveScan ||
            op == glslang::EOpMinInvocationsExclusiveScan) {
            if (isFloat)
                opCode = spv::OpGroupFMin;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMin;
                else
                    opCode = spv::OpGroupSMin;
            }
        } else if (op == glslang::EOpMaxInvocations ||
                   op == glslang::EOpMaxInvocationsInclusiveScan ||
                   op == glslang::EOpMaxInvocationsExclusiveScan) {
            if (isFloat)
                opCode = spv::OpGroupFMax;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMax;
                else
                    opCode = spv::OpGroupSMax;
            }
        } else {
            if (isFloat)
                opCode = spv::OpGroupFAdd;
            else
                opCode = spv::OpGroupIAdd;
        }

        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);

        break;
    case glslang::EOpMinInvocationsNonUniform:
    case glslang::EOpMaxInvocationsNonUniform:
    case glslang::EOpAddInvocationsNonUniform:
    case glslang::EOpMinInvocationsInclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsInclusiveScanNonUniform:
    case glslang::EOpAddInvocationsInclusiveScanNonUniform:
    case glslang::EOpMinInvocationsExclusiveScanNonUniform:
    case glslang::EOpMaxInvocationsExclusiveScanNonUniform:
    case glslang::EOpAddInvocationsExclusiveScanNonUniform:
        if (op == glslang::EOpMinInvocationsNonUniform ||
            op == glslang::EOpMinInvocationsInclusiveScanNonUniform ||
            op == glslang::EOpMinInvocationsExclusiveScanNonUniform) {
            if (isFloat)
                opCode = spv::OpGroupFMinNonUniformAMD;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMinNonUniformAMD;
                else
                    opCode = spv::OpGroupSMinNonUniformAMD;
            }
        }
        else if (op == glslang::EOpMaxInvocationsNonUniform ||
                 op == glslang::EOpMaxInvocationsInclusiveScanNonUniform ||
                 op == glslang::EOpMaxInvocationsExclusiveScanNonUniform) {
            if (isFloat)
                opCode = spv::OpGroupFMaxNonUniformAMD;
            else {
                if (isUnsigned)
                    opCode = spv::OpGroupUMaxNonUniformAMD;
                else
                    opCode = spv::OpGroupSMaxNonUniformAMD;
            }
        }
        else {
            if (isFloat)
                opCode = spv::OpGroupFAddNonUniformAMD;
            else
                opCode = spv::OpGroupIAddNonUniformAMD;
        }

        if (builder.isVectorType(typeId))
            return CreateInvocationsVectorOperation(opCode, groupOperation, typeId, operands);

        break;
    default:
        logger->missingFunctionality("invocation operation");
        return spv::NoResult;
    }

    assert(opCode != spv::OpNop);
    return builder.createOp(opCode, typeId, spvGroupOperands);
}